

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderReturnTests.cpp
# Opt level: O3

void deqp::gles2::Functional::evalReturnDynamic(ShaderEvalContext *c)

{
  float fVar1;
  float fVar2;
  long lVar3;
  uint uVar4;
  float fVar5;
  float afStack_2c [5];
  int aiStack_18 [6];
  
  fVar1 = (c->coords).m_data[0];
  fVar2 = (c->coords).m_data[1];
  fVar5 = fVar1 + fVar2;
  afStack_2c[3] = (c->coords).m_data[2];
  uVar4 = -(uint)(fVar5 < 0.0);
  afStack_2c[4] = fVar2;
  if (0.0 <= fVar5) {
    afStack_2c[4] = afStack_2c[3];
    afStack_2c[3] = fVar2;
  }
  afStack_2c[2] = (float)(~uVar4 & (uint)fVar1 | (uint)(c->coords).m_data[3] & uVar4);
  aiStack_18[2] = 0;
  aiStack_18[3] = 1;
  aiStack_18[4] = 2;
  lVar3 = 2;
  do {
    (c->color).m_data[aiStack_18[lVar3]] = afStack_2c[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 5);
  return;
}

Assistant:

inline void evalReturnDynamic	(ShaderEvalContext& c) { c.color.xyz() = (c.coords.x()+c.coords.y() >= 0.0f) ? c.coords.swizzle(0,1,2) : c.coords.swizzle(3,2,1); }